

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_test_helper.cpp
# Opt level: O2

bool duckdb::ArrowTestHelper::CompareResults
               (Connection *con,
               unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
               *arrow,unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                      *duck,string *query)

{
  type pQVar1;
  pointer pMVar2;
  pointer this;
  long lVar3;
  MaterializedRelation *pMVar4;
  pointer *__ptr;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  duck_collection;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  arrow_collection;
  shared_ptr<duckdb::MaterializedRelation,_true> duck_rel;
  shared_ptr<duckdb::MaterializedRelation,_true> arrow_rel;
  shared_ptr<duckdb::SetOpRelation,_true> except_rel;
  string error;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> local_a8;
  undefined1 local_a0 [16];
  shared_ptr<duckdb::MaterializedRelation,_true> local_90;
  shared_ptr<duckdb::MaterializedRelation,_true> local_80;
  string local_70 [32];
  shared_ptr<duckdb::MaterializedRelation,_true> local_50;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator*(arrow);
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  duckdb::MaterializedQueryResult::TakeCollection();
  make_shared_ptr<duckdb::MaterializedRelation,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::vector<std::__cxx11::string,true>&,char_const(&)[6]>
            ((shared_ptr<duckdb::ClientContext,_true> *)&local_80,
             (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              *)con,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     *)(local_a0 + 8),(char (*) [6])(pQVar1 + 0xb0));
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator->(duck);
  duckdb::MaterializedQueryResult::TakeCollection();
  pMVar2 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->(duck);
  make_shared_ptr<duckdb::MaterializedRelation,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::vector<std::__cxx11::string,true>&,char_const(&)[5]>
            ((shared_ptr<duckdb::ClientContext,_true> *)&local_90,
             (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              *)con,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     *)local_a0,(char (*) [5])(pMVar2 + 0xb0));
  local_70[0] = (string)0x2;
  local_a8.super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
  super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl._0_1_ = 1;
  make_shared_ptr<duckdb::SetOpRelation,duckdb::shared_ptr<duckdb::MaterializedRelation,true>&,duckdb::shared_ptr<duckdb::MaterializedRelation,true>&,duckdb::SetOperationType,bool>
            (&local_50,&local_90,(SetOperationType *)&local_80,(bool *)local_70);
  shared_ptr<duckdb::SetOpRelation,_true>::operator->
            ((shared_ptr<duckdb::SetOpRelation,_true> *)&local_50);
  duckdb::Relation::Execute();
  this = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator->
                   (&local_a8);
  QueryResult::Cast<duckdb::MaterializedQueryResult>(this);
  lVar3 = duckdb::MaterializedQueryResult::RowCount();
  if (lVar3 != 0) {
    puts("-------------------------------------");
    printf("Arrow round-trip failed: %s\n",local_40);
    puts("-------------------------------------");
    printf("Query: %s\n",(query->_M_dataplus)._M_p);
    puts("-----------------DuckDB-------------------");
    pMVar4 = shared_ptr<duckdb::MaterializedRelation,_true>::operator->(&local_90);
    (**(code **)(*(long *)pMVar4 + 0x30))(local_70,pMVar4,0);
    duckdb::Printer::Print(local_70);
    std::__cxx11::string::~string(local_70);
    puts("-----------------Arrow--------------------");
    pMVar4 = shared_ptr<duckdb::MaterializedRelation,_true>::operator->(&local_80);
    (**(code **)(*(long *)pMVar4 + 0x30))(local_70,pMVar4,0);
    duckdb::Printer::Print(local_70);
    std::__cxx11::string::~string(local_70);
    puts("-------------------------------------");
  }
  if ((long *)CONCAT71(local_a8.
                       super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                       .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl._1_7_,
                       local_a8.
                       super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                       .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl._0_1_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_a8.
                                   super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                                   .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl
                                   ._1_7_,local_a8.
                                          super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                                          .super__Head_base<0UL,_duckdb::QueryResult_*,_false>.
                                          _M_head_impl._0_1_) + 8))();
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_50.internal.
              super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_90.internal.
              super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                 *)local_a0);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_80.internal.
              super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                 *)(local_a0 + 8));
  std::__cxx11::string::~string((string *)&local_40);
  return lVar3 == 0;
}

Assistant:

bool ArrowTestHelper::CompareResults(Connection &con, unique_ptr<QueryResult> arrow,
                                     unique_ptr<MaterializedQueryResult> duck, const string &query) {
	auto &materialized_arrow = (MaterializedQueryResult &)*arrow;
	// compare the results
	string error;

	auto arrow_collection = materialized_arrow.TakeCollection();
	auto arrow_rel = make_shared_ptr<MaterializedRelation>(con.context, std::move(arrow_collection),
	                                                       materialized_arrow.names, "arrow");

	auto duck_collection = duck->TakeCollection();
	auto duck_rel = make_shared_ptr<MaterializedRelation>(con.context, std::move(duck_collection), duck->names, "duck");

	// We perform a SELECT * FROM "duck_rel" EXCEPT ALL SELECT * FROM "arrow_rel"
	// this will tell us if there are tuples missing from 'arrow_rel' that are present in 'duck_rel'
	auto except_rel = make_shared_ptr<SetOpRelation>(duck_rel, arrow_rel, SetOperationType::EXCEPT, /*setop_all=*/true);
	auto except_result_p = except_rel->Execute();
	auto &except_result = except_result_p->Cast<MaterializedQueryResult>();
	if (except_result.RowCount() != 0) {
		printf("-------------------------------------\n");
		printf("Arrow round-trip failed: %s\n", error.c_str());
		printf("-------------------------------------\n");
		printf("Query: %s\n", query.c_str());
		printf("-----------------DuckDB-------------------\n");
		Printer::Print(duck_rel->ToString(0));
		printf("-----------------Arrow--------------------\n");
		Printer::Print(arrow_rel->ToString(0));
		printf("-------------------------------------\n");
		return false;
	}
	return true;
}